

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

bool __thiscall
cmOrderDirectoriesConstraintLibrary::FindConflict
          (cmOrderDirectoriesConstraintLibrary *this,string *dir)

{
  bool bVar1;
  reference pbVar2;
  undefined1 local_a0 [8];
  string fname;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  iterator i;
  undefined1 local_60 [8];
  string ext;
  string lib;
  string *dir_local;
  cmOrderDirectoriesConstraintLibrary *this_local;
  
  bVar1 = cmOrderDirectoriesConstraint::FileMayConflict
                    (&this->super_cmOrderDirectoriesConstraint,dir,
                     &(this->super_cmOrderDirectoriesConstraint).FileName);
  if (bVar1) {
    this_local._7_1_ = 1;
  }
  else {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&((this->super_cmOrderDirectoriesConstraint).OD)->LinkExtensions);
    if ((!bVar1) &&
       (bVar1 = cmsys::RegularExpression::find
                          (&((this->super_cmOrderDirectoriesConstraint).OD)->RemoveLibraryExtension,
                           &(this->super_cmOrderDirectoriesConstraint).FileName), bVar1)) {
      cmsys::RegularExpression::match_abi_cxx11_
                ((string *)((long)&ext.field_2 + 8),
                 &((this->super_cmOrderDirectoriesConstraint).OD)->RemoveLibraryExtension,1);
      cmsys::RegularExpression::match_abi_cxx11_
                ((string *)local_60,
                 &((this->super_cmOrderDirectoriesConstraint).OD)->RemoveLibraryExtension,2);
      local_78._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&((this->super_cmOrderDirectoriesConstraint).OD)->LinkExtensions);
      while( true ) {
        fname.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&((this->super_cmOrderDirectoriesConstraint).OD)->LinkExtensions);
        bVar1 = __gnu_cxx::operator!=
                          (&local_78,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&fname.field_2 + 8));
        if (!bVar1) break;
        pbVar2 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_78);
        bVar1 = std::operator!=(pbVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_60);
        if (bVar1) {
          std::__cxx11::string::string((string *)local_a0,(string *)(ext.field_2._M_local_buf + 8));
          pbVar2 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_78);
          std::__cxx11::string::operator+=((string *)local_a0,(string *)pbVar2);
          bVar1 = cmOrderDirectoriesConstraint::FileMayConflict
                            (&this->super_cmOrderDirectoriesConstraint,dir,(string *)local_a0);
          if (bVar1) {
            this_local._7_1_ = 1;
          }
          std::__cxx11::string::~string((string *)local_a0);
          if (bVar1) goto LAB_00890f0a;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_78);
      }
      bVar1 = false;
LAB_00890f0a:
      std::__cxx11::string::~string((string *)local_60);
      std::__cxx11::string::~string((string *)(ext.field_2._M_local_buf + 8));
      if (bVar1 != false) goto LAB_00890f44;
    }
    this_local._7_1_ = 0;
  }
LAB_00890f44:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmOrderDirectoriesConstraintLibrary::FindConflict(std::string const& dir)
{
  // We have the library file name.  Check if it will be found.
  if(this->FileMayConflict(dir, this->FileName))
    {
    return true;
    }

  // Now check if the file exists with other extensions the linker
  // might consider.
  if(!this->OD->LinkExtensions.empty() &&
     this->OD->RemoveLibraryExtension.find(this->FileName))
    {
    std::string lib = this->OD->RemoveLibraryExtension.match(1);
    std::string ext = this->OD->RemoveLibraryExtension.match(2);
    for(std::vector<std::string>::iterator
          i = this->OD->LinkExtensions.begin();
        i != this->OD->LinkExtensions.end(); ++i)
      {
      if(*i != ext)
        {
        std::string fname = lib;
        fname += *i;
        if(this->FileMayConflict(dir, fname))
          {
          return true;
          }
        }
      }
    }
  return false;
}